

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long>::operator()
          (make_exception<const_char_*,_unsigned_long> *this,stringstream *msg,char *arg,
          unsigned_long args)

{
  make_exception<unsigned_long> local_29;
  unsigned_long local_28;
  unsigned_long args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_unsigned_long> *this_local;
  
  local_28 = args;
  args_local = (unsigned_long)arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<unsigned_long>::operator()(&local_29,(stringstream *)arg_local,local_28);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }